

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O3

int mem_read(jas_stream_obj_t *obj,char *buf,uint cnt)

{
  int iVar1;
  ulong uVar2;
  
  if (buf != (char *)0x0) {
    iVar1 = jas_getdbglevel();
    if (99 < iVar1) {
      jas_eprintf("mem_read(%p, %p, %u)\n",obj,buf,(ulong)cnt);
    }
    uVar2 = *(long *)((long)obj + 0x10) - *(long *)((long)obj + 0x18);
    if ((long)(ulong)cnt <= (long)uVar2) {
      uVar2 = (ulong)cnt;
    }
    memcpy(buf,(void *)(*(long *)((long)obj + 0x18) + *obj),uVar2 & 0xffffffff);
    *(long *)((long)obj + 0x18) = *(long *)((long)obj + 0x18) + (uVar2 & 0xffffffff);
    return (int)uVar2;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                ,0x495,"int mem_read(jas_stream_obj_t *, char *, unsigned int)");
}

Assistant:

static int mem_read(jas_stream_obj_t *obj, char *buf, unsigned cnt)
{
	ssize_t n;
	jas_stream_memobj_t *m;
	assert(buf);

	JAS_DBGLOG(100, ("mem_read(%p, %p, %u)\n", obj, buf, cnt));
	m = (jas_stream_memobj_t *)obj;
	n = m->len_ - m->pos_;
	cnt = JAS_MIN(n, cnt);
	memcpy(buf, &m->buf_[m->pos_], cnt);
	m->pos_ += cnt;
	return cnt;
}